

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  CClient *this;
  IKernel *pIVar4;
  IEngine *pIVar5;
  IConsole *pIVar6;
  IStorage *pIVar7;
  IConfigManager *pIVar8;
  IEngineSound *pIVar9;
  IEngineInput *pIVar10;
  IEngineTextRender *pIVar11;
  IEngineMap *pIVar12;
  IMapChecker *pIVar13;
  IEngineMasterServer *pIVar14;
  IEditor *pIVar15;
  IGameClient *pIVar16;
  undefined4 extraout_var;
  char *pAddress;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  char **argv_local;
  int argc_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  argv_local = argv;
  argc_local = argc;
  cmdline_fix(&argc_local,&argv_local);
  lVar1 = 1;
  do {
    lVar17 = lVar1;
    lVar18 = (long)argc_local;
    if ((lVar18 <= lVar17) || (iVar2 = str_comp("-d",argv_local[lVar17]), iVar2 == 0)) break;
    iVar2 = str_comp("--default",argv_local[lVar17]);
    lVar1 = lVar17 + 1;
  } while (iVar2 != 0);
  iVar2 = secure_random_init();
  this = (CClient *)mem_alloc(0x2d9cb8);
  mem_zero(this,0x2d9cb8);
  CClient::CClient(this);
  pIVar4 = IKernel::Create();
  (**pIVar4->_vptr_IKernel)(pIVar4,"client",this);
  CClient::RegisterInterfaces(this);
  pIVar5 = CreateEngine("Teeworlds");
  pIVar6 = CreateConsole(2);
  pIVar7 = CreateStorage("Teeworlds",2,argc_local,argv_local);
  pIVar8 = CreateConfigManager();
  pIVar9 = CreateEngineSound();
  pIVar10 = CreateEngineInput();
  pIVar11 = CreateEngineTextRender();
  pIVar12 = CreateEngineMap();
  pIVar13 = CreateMapChecker();
  pIVar14 = CreateEngineMasterServer();
  if (iVar2 == 0) {
    iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"engine",pIVar5);
    if (((((((char)iVar2 != '\0') &&
           (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"console",pIVar6), (char)iVar2 != '\0')) &&
          (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"config",pIVar8), (char)iVar2 != '\0')) &&
         ((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"enginesound",pIVar9), (char)iVar2 != '\0' &&
          (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"sound",pIVar9), (char)iVar2 != '\0')))) &&
        ((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"engineinput",pIVar10), (char)iVar2 != '\0' &&
         ((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"input",pIVar10), (char)iVar2 != '\0' &&
          (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"enginetextrender",pIVar11), (char)iVar2 != '\0'
          )))))) &&
       ((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"textrender",pIVar11), (char)iVar2 != '\0' &&
        ((((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"enginemap",pIVar12), (char)iVar2 != '\0' &&
           (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"map",pIVar12), (char)iVar2 != '\0')) &&
          (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"mapchecker",pIVar13), (char)iVar2 != '\0')) &&
         ((iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"enginemasterserver",pIVar14),
          (char)iVar2 != '\0' &&
          (iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"masterserver",pIVar14), (char)iVar2 != '\0'))))
        )))) {
      pIVar15 = CreateEditor();
      iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"editor",pIVar15);
      if ((char)iVar2 != '\0') {
        pIVar16 = CreateGameClient();
        iVar2 = (**pIVar4->_vptr_IKernel)(pIVar4,"gameclient",pIVar16);
        if ((char)iVar2 != '\0') {
          iVar3 = (**pIVar4->_vptr_IKernel)(pIVar4,"storage",pIVar7);
          iVar2 = -1;
          if ((char)iVar3 != '\0') {
            (*(pIVar5->super_IInterface)._vptr_IInterface[2])();
            (*(pIVar8->super_IInterface)._vptr_IInterface[2])(pIVar8,2);
            (*(pIVar6->super_IInterface)._vptr_IInterface[2])();
            (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[2])(pIVar14);
            (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[4])(pIVar14);
            CClient::RegisterCommands(this);
            CClient::InitInterfaces(this);
            iVar2 = (*pIVar4->_vptr_IKernel[2])(pIVar4,"gameclient");
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2));
            if (lVar18 <= lVar17) {
              iVar2 = (*(pIVar6->super_IInterface)._vptr_IInterface[0x16])(pIVar6,"settings07.cfg");
              if ((char)iVar2 == '\0') {
                (*(pIVar6->super_IInterface)._vptr_IInterface[0x16])(pIVar6,"settings.cfg");
              }
              (*(pIVar6->super_IInterface)._vptr_IInterface[0x16])(pIVar6,"autoexec.cfg");
              if (1 < argc_local) {
                if ((argc_local == 2) &&
                   (pAddress = str_startswith(argv_local[1],"teeworlds:"), pAddress != (char *)0x0))
                {
                  CClient::ConnectOnStart(this,pAddress);
                }
                else {
                  (*(pIVar6->super_IInterface)._vptr_IInterface[7])
                            (pIVar6,(ulong)(argc_local - 1),argv_local + 1);
                }
              }
            }
            this->m_pConfig->m_ClLastVersionPlayed = 0x705;
            (*(pIVar8->super_IInterface)._vptr_IInterface[4])(pIVar8);
            (*(this->m_pEngine->super_IInterface)._vptr_IInterface[4])();
            dbg_msg("client","starting...");
            CClient::Run(this);
            (*(pIVar5->super_IInterface)._vptr_IInterface[3])(pIVar5);
            (*(pIVar8->super_IInterface)._vptr_IInterface[5])(pIVar8,0);
            (**(this->super_IClient).super_IInterface._vptr_IInterface)(this);
            mem_free(this);
            (*pIVar4->_vptr_IKernel[4])();
            (*(pIVar5->super_IInterface)._vptr_IInterface[1])(pIVar5);
            (*(pIVar6->super_IInterface)._vptr_IInterface[1])();
            if (pIVar7 != (IStorage *)0x0) {
              (*(pIVar7->super_IInterface)._vptr_IInterface[1])();
            }
            (*(pIVar8->super_IInterface)._vptr_IInterface[1])();
            if (pIVar9 != (IEngineSound *)0x0) {
              (*(pIVar9->super_ISound).super_IInterface._vptr_IInterface[1])();
            }
            if (pIVar10 != (IEngineInput *)0x0) {
              (*(pIVar10->super_IInput).super_IInterface._vptr_IInterface[1])();
            }
            if (pIVar11 != (IEngineTextRender *)0x0) {
              (*(pIVar11->super_ITextRender).super_IInterface._vptr_IInterface[1])(pIVar11);
            }
            if (pIVar12 != (IEngineMap *)0x0) {
              (*(pIVar12->super_IMap).super_IInterface._vptr_IInterface[1])(pIVar12);
            }
            if (pIVar13 != (IMapChecker *)0x0) {
              (*(pIVar13->super_IInterface)._vptr_IInterface[1])();
            }
            (*(pIVar14->super_IMasterServer).super_IInterface._vptr_IInterface[1])();
            cmdline_free(argc_local,argv_local);
            iVar2 = 0;
          }
          goto LAB_0011c8c3;
        }
      }
    }
  }
  else {
    dbg_msg("secure","could not initialize secure RNG");
  }
  iVar2 = -1;
LAB_0011c8c3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int main(int argc, const char **argv) // ignore_convention
#endif
{
	cmdline_fix(&argc, &argv);
#if defined(CONF_FAMILY_WINDOWS)
	bool QuickEditMode = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("--quickeditmode", argv[i]) == 0) // ignore_convention
		{
			QuickEditMode = true;
		}
	}
#endif

	bool UseDefaultConfig = false;
	for(int i = 1; i < argc; i++) // ignore_convention
	{
		if(str_comp("-d", argv[i]) == 0 || str_comp("--default", argv[i]) == 0) // ignore_convention
		{
			UseDefaultConfig = true;
			break;
		}
	}

	bool RandInitFailed = secure_random_init() != 0;

	CClient *pClient = CreateClient();
	IKernel *pKernel = IKernel::Create();
	pKernel->RegisterInterface(pClient);
	pClient->RegisterInterfaces();

	// create the components
	int FlagMask = CFGFLAG_CLIENT;
	IEngine *pEngine = CreateEngine("Teeworlds");
	IConsole *pConsole = CreateConsole(FlagMask);
	IStorage *pStorage = CreateStorage("Teeworlds", IStorage::STORAGETYPE_CLIENT, argc, argv); // ignore_convention
	IConfigManager *pConfigManager = CreateConfigManager();
	IEngineSound *pEngineSound = CreateEngineSound();
	IEngineInput *pEngineInput = CreateEngineInput();
	IEngineTextRender *pEngineTextRender = CreateEngineTextRender();
	IEngineMap *pEngineMap = CreateEngineMap();
	IMapChecker *pMapChecker = CreateMapChecker();
	IEngineMasterServer *pEngineMasterServer = CreateEngineMasterServer();

	if(RandInitFailed)
	{
		dbg_msg("secure", "could not initialize secure RNG");
		return -1;
	}

	{
		bool RegisterFail = false;

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pEngine);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConsole);
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pConfigManager);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineSound*>(pEngineSound)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ISound*>(pEngineSound));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineInput*>(pEngineInput)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IInput*>(pEngineInput));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineTextRender*>(pEngineTextRender)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<ITextRender*>(pEngineTextRender));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMap*>(pEngineMap)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMap*>(pEngineMap));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pMapChecker);

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IEngineMasterServer*>(pEngineMasterServer)); // register as both
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(static_cast<IMasterServer*>(pEngineMasterServer));

		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateEditor());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(CreateGameClient());
		RegisterFail = RegisterFail || !pKernel->RegisterInterface(pStorage);

		if(RegisterFail)
			return -1;
	}

	pEngine->Init();
	pConfigManager->Init(FlagMask);
	pConsole->Init();
	pEngineMasterServer->Init();
	pEngineMasterServer->Load();

	// register all console commands
	pClient->RegisterCommands();

	// init client's interfaces
	pClient->InitInterfaces();

	pKernel->RequestInterface<IGameClient>()->OnConsoleInit();

	if(!UseDefaultConfig)
	{
		// execute config file
		if(!pConsole->ExecuteFile(SETTINGS_FILENAME ".cfg"))
			pConsole->ExecuteFile("settings.cfg"); // fallback to legacy naming scheme

		// execute autoexec file
		pConsole->ExecuteFile("autoexec.cfg");

		// parse the command line arguments
		if(argc > 1) // ignore_convention
		{
			const char *pAddress = 0;
			if(argc == 2)
			{
				pAddress = str_startswith(argv[1], "teeworlds:");
			}
			if(pAddress)
			{
				pClient->ConnectOnStart(pAddress);
			}
			else
			{
				pConsole->ParseArguments(argc - 1, &argv[1]);
			}
		}
	}
#if defined(CONF_FAMILY_WINDOWS)
	CConfig *pConfig = pConfigManager->Values();
	bool HideConsole = false;
	#ifdef CONF_RELEASE
	if(!(pConfig->m_ShowConsoleWindow&2))
	#else
	if(!(pConfig->m_ShowConsoleWindow&1))
	#endif
	{
		HideConsole = true;
		FreeConsole();
	}
	else if(!QuickEditMode)
		dbg_console_init();
#endif

	pClient->DoVersionSpecificActions();

	// restore empty config strings to their defaults
	pConfigManager->RestoreStrings();

	pClient->Engine()->InitLogfile();

	// run the client
	dbg_msg("client", "starting...");
	pClient->Run();

	// wait for background jobs to finish
	pEngine->ShutdownJobs();

	// write down the config and quit
	pConfigManager->Save();

#if defined(CONF_FAMILY_WINDOWS)
	if(!HideConsole && !QuickEditMode)
		dbg_console_cleanup();
#endif
	// free components
	pClient->~CClient();
	mem_free(pClient);
	delete pKernel;
	delete pEngine;
	delete pConsole;
	delete pStorage;
	delete pConfigManager;
	delete pEngineSound;
	delete pEngineInput;
	delete pEngineTextRender;
	delete pEngineMap;
	delete pMapChecker;
	delete pEngineMasterServer;

	cmdline_free(argc, argv);
	return 0;
}